

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testWav.cpp
# Opt level: O1

void anon_unknown.dwarf_34dba8::wavEncodeDecode
               (Array2D<unsigned_short> *a,Array2D<unsigned_short> *b,int nx,int ny)

{
  unsigned_short *puVar1;
  ushort uVar2;
  ulong uVar3;
  unsigned_short *puVar4;
  ulong uVar5;
  
  if (ny < 1) {
    uVar2 = 0;
  }
  else {
    puVar1 = a->_data;
    uVar3 = 0;
    uVar2 = 0;
    do {
      if (0 < nx) {
        uVar5 = 0;
        do {
          if (uVar2 <= puVar1[uVar5]) {
            uVar2 = puVar1[uVar5];
          }
          uVar5 = uVar5 + 1;
        } while ((uint)nx != uVar5);
      }
      uVar3 = uVar3 + 1;
      puVar1 = puVar1 + a->_sizeY;
    } while (uVar3 != (uint)ny);
  }
  Imf_3_4::wav2Encode(a->_data,nx,1,ny,nx,uVar2);
  Imf_3_4::wav2Decode(a->_data,nx,1,ny,nx,uVar2);
  if (0 < ny) {
    puVar1 = a->_data;
    puVar4 = b->_data;
    uVar3 = 0;
    do {
      if (0 < nx) {
        uVar5 = 0;
        do {
          if (puVar1[uVar5] != puVar4[uVar5]) {
            __assert_fail("a[y][x] == b[y][x]",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testWav.cpp"
                          ,0x9b,
                          "void (anonymous namespace)::wavEncodeDecode(Array2D<unsigned short> &, const Array2D<unsigned short> &, int, int)"
                         );
          }
          uVar5 = uVar5 + 1;
        } while ((uint)nx != uVar5);
      }
      uVar3 = uVar3 + 1;
      puVar4 = puVar4 + b->_sizeY;
      puVar1 = puVar1 + a->_sizeY;
    } while (uVar3 != (uint)ny);
  }
  return;
}

Assistant:

void
wavEncodeDecode (
    Array2D<unsigned short>&       a,
    const Array2D<unsigned short>& b,
    int                            nx,
    int                            ny)
{
    unsigned short mx = maxValue (a, nx, ny);

    //cout << "encoding " << flush;

    wav2Encode (&a[0][0], nx, 1, ny, nx, mx);

    //cout << "decoding " << flush;

    wav2Decode (&a[0][0], nx, 1, ny, nx, mx);

    //cout << "comparing" << endl;

    for (int y = 0; y < ny; ++y)
    {
        for (int x = 0; x < nx; ++x)
        {
            //cout << x << ' ' << y << ' ' << a[y][x] << ' ' << b[y][x] << endl;
            assert (a[y][x] == b[y][x]);
        }
    }
}